

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

bool __thiscall Func::HasArrayInfo(Func *this)

{
  Func *this_00;
  bool bVar1;
  BOOL BVar2;
  uint sourceContextId;
  uint functionId;
  intptr_t iVar3;
  
  this_00 = this->topFunc;
  bVar1 = HasProfileInfo(this);
  if ((((bVar1) && (iVar3 = GetWeakFuncRef(this), iVar3 != 0)) &&
      ((BVar2 = HasTry(this_00), BVar2 == 0 || (bVar1 = DoOptimizeTry(this_00), bVar1)))) &&
     (bVar1 = DoGlobOpt(this_00), bVar1)) {
    sourceContextId = GetSourceContextId(this_00);
    functionId = GetLocalFunctionId(this_00);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,LoopFastPathPhase,sourceContextId,functionId);
    return !bVar1;
  }
  return false;
}

Assistant:

bool                HasArrayInfo()
    {
        const auto top = this->GetTopFunc();
        return this->HasProfileInfo() && this->GetWeakFuncRef() && !(top->HasTry() && !top->DoOptimizeTry()) &&
            top->DoGlobOpt() && !PHASE_OFF(Js::LoopFastPathPhase, top);
    }